

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O3

int http_parser_parse_url_(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  uint16_t uVar6;
  state s;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  uint16_t uVar13;
  uint uVar14;
  long lVar15;
  
  u->field_set = 0;
  u->port = 0;
  if ((long)buflen < 1) {
    s = (state)(is_connect != 0);
  }
  else {
    s = (uint)(is_connect != 0) * 4 + s_req_spaces_before_url;
    uVar14 = 7;
    lVar15 = 0;
    uVar10 = 0;
    bVar3 = false;
    do {
      s = parse_url_char_(s,buf[lVar15]);
      switch(s) {
      case s_dead:
        goto switchD_0014eac8_caseD_1;
      default:
        __assert_fail("!\"Unexpected state\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/http_parser/http_parser.c"
                      ,0x84a,
                      "int http_parser_parse_url_(const char *, size_t, int, struct http_parser_url *)"
                     );
      case s_req_schema:
        uVar9 = 0;
        break;
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        goto switchD_0014eac8_caseD_15;
      case s_req_server:
        uVar9 = 1;
        break;
      case s_req_server_with_at:
        uVar9 = 1;
        bVar3 = true;
        break;
      case s_req_path:
        uVar9 = 3;
        break;
      case s_req_query_string:
        uVar9 = 4;
        break;
      case s_req_fragment:
        uVar9 = 5;
      }
      if (uVar9 == uVar14) {
        puVar1 = &u->field_data[uVar14].len;
        *puVar1 = *puVar1 + 1;
      }
      else {
        u->field_data[uVar9].off = (uint16_t)lVar15;
        u->field_data[uVar9].len = 1;
        uVar10 = uVar10 | 1 << uVar9;
        u->field_set = (uint16_t)uVar10;
        uVar14 = uVar9;
      }
switchD_0014eac8_caseD_15:
      lVar4 = lVar15 + 1;
      lVar15 = lVar15 + 1;
    } while (buf + lVar4 < buf + buflen);
    uVar12 = (ushort)uVar10;
    if ((uVar10 & 3) != 0) {
      iVar7 = (uint)!bVar3 * 2 + 2;
      uVar8 = (ulong)u->field_data[1].off;
      uVar11 = (ulong)u->field_data[1].len;
      u->field_data[1].len = 0;
      if (uVar11 != 0) {
        lVar15 = uVar11 + uVar8;
        uVar13 = 0;
        do {
          bVar2 = buf[uVar8];
          uVar14 = (uint)bVar2;
          switch((long)&switchD_0014ebae::switchdataD_0017b99c +
                 (long)(int)(&switchD_0014ebae::switchdataD_0017b99c)[iVar7 - 2]) {
          case 0x14ebb1:
            iVar5 = 4;
            if (uVar14 != 0x40) {
              if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) &&
                  ((0x3e < bVar2 - 0x21 ||
                   ((0x4000000016003ff9U >> ((ulong)(bVar2 - 0x21) & 0x3f) & 1) == 0)))) &&
                 (uVar14 != 0x7e)) {
                return 1;
              }
              if (iVar7 == 3) {
                uVar6 = u->field_data[6].len + 1;
              }
              else {
                u->field_data[6].off = (uint16_t)uVar8;
                uVar10 = uVar10 | 0x40;
                u->field_set = (uint16_t)uVar10;
                uVar6 = 1;
              }
              u->field_data[6].len = uVar6;
              iVar5 = 3;
            }
            break;
          case 0x14ec61:
            iVar5 = 5;
            if (uVar14 != 0x5b) {
              if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) {
                if (0x32 < uVar14 - 0x2d) {
                  return 1;
                }
                if ((0x4000000000003U >> ((ulong)(uVar14 - 0x2d) & 0x3f) & 1) == 0) {
                  return 1;
                }
              }
              u->field_data[1].off = (uint16_t)uVar8;
              uVar13 = uVar13 + 1;
              u->field_data[1].len = uVar13;
              iVar5 = 6;
            }
          }
          iVar7 = iVar5;
          uVar12 = (ushort)uVar10;
          lVar4 = uVar8 + 1;
          uVar8 = uVar8 + 1;
        } while (buf + lVar4 < buf + lVar15);
      }
      if ((iVar7 - 2U < 8) && ((0xafU >> (iVar7 - 2U & 0x1f) & 1) != 0)) {
        return 1;
      }
    }
    if (is_connect == 0) {
      if ((uVar12 & 4) == 0) {
        return 0;
      }
    }
    else if (uVar12 != 6) {
      return 1;
    }
    uVar8 = strtoul(buf + u->field_data[2].off,(char **)0x0,10);
    s = s_dead;
    if (uVar8 < 0x10000) {
      u->port = (uint16_t)uVar8;
      s = 0;
    }
  }
switchD_0014eac8_caseD_1:
  return s;
}

Assistant:

int
http_parser_parse_url_(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  uf = old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char_(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* FALLTROUGH */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = p - buf;
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & ((1 << UF_SCHEMA) | (1 << UF_HOST))) != 0) {
    if (http_parse_host_(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    /* Don't bother with endp; we've already validated the string */
    unsigned long v = strtoul(buf + u->field_data[UF_PORT].off, NULL, 10);

    /* Ports have a max value of 2^16 */
    if (v > 0xffff) {
      return 1;
    }

    u->port = (uint16_t) v;
  }

  return 0;
}